

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O2

void Amap_LibCollectFanins_rec(Amap_Lib_t *pLib,Amap_Nod_t *pNod,Vec_Int_t *vFanins)

{
  Amap_Nod_t *pAVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Amap_Nod_t *pAVar5;
  
  uVar2 = (uint)*(ushort *)pNod;
  do {
    pAVar5 = pNod;
    if ((short)uVar2 == 0) {
      iVar3 = 0;
      goto LAB_0033d349;
    }
    uVar2 = Abc_Lit2Var((int)pAVar5->iFan0);
    pAVar1 = pLib->pNodes;
    iVar3 = Abc_LitIsCompl((int)pAVar5->iFan0);
    if ((iVar3 == 0) && ((*(uint *)pAVar5 ^ *(uint *)(pAVar1 + uVar2)) < 0x1000000)) {
      Amap_LibCollectFanins_rec(pLib,pAVar1 + uVar2,vFanins);
    }
    else {
      Vec_IntPush(vFanins,(int)pAVar5->iFan0);
    }
    uVar4 = Abc_Lit2Var((int)pAVar5->iFan1);
    pAVar1 = pLib->pNodes;
    iVar3 = Abc_LitIsCompl((int)pAVar5->iFan1);
    if (iVar3 != 0) break;
    uVar2 = *(uint *)(pAVar1 + uVar4);
    pNod = pAVar1 + uVar4;
  } while ((*(uint *)pAVar5 ^ uVar2) < 0x1000000);
  iVar3 = (int)pAVar5->iFan1;
LAB_0033d349:
  Vec_IntPush(vFanins,iVar3);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects fanins of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Amap_LibCollectFanins_rec( Amap_Lib_t * pLib, Amap_Nod_t * pNod, Vec_Int_t * vFanins )
{
    Amap_Nod_t * pFan0, * pFan1;
    if ( pNod->Id == 0 )
    {
        Vec_IntPush( vFanins, 0 );
        return;
    }
    pFan0 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
    if ( Abc_LitIsCompl(pNod->iFan0) || pFan0->Type != pNod->Type )
        Vec_IntPush( vFanins, pNod->iFan0 );
    else
        Amap_LibCollectFanins_rec( pLib, pFan0, vFanins );
    pFan1 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
    if ( Abc_LitIsCompl(pNod->iFan1) || pFan1->Type != pNod->Type )
        Vec_IntPush( vFanins, pNod->iFan1 );
    else
        Amap_LibCollectFanins_rec( pLib, pFan1, vFanins );
}